

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

vector<Client_*,_std::allocator<Client_*>_> * __thiscall Server::Select(Server *this,double timeout)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  __fd_mask *p_Var2;
  int iVar3;
  uint uVar4;
  _List_node_base *p_Var5;
  Client *this_00;
  bool bVar6;
  int iVar7;
  fd_set *__arr;
  _List_node_base *p_Var8;
  impl_ *piVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  Client *client;
  timeval timeout_val;
  Client *local_38;
  timeval local_30;
  
  local_30.tv_sec = (__time_t)timeout;
  local_30.tv_usec = (__suseconds_t)((timeout - (double)local_30.tv_sec) * 1000000.0);
  if (Select(double)::selected == '\0') {
    Select();
  }
  piVar9 = this->impl;
  iVar7 = piVar9->sock;
  (piVar9->read_fds).fds_bits[0] = 0;
  (piVar9->read_fds).fds_bits[1] = 0;
  (piVar9->read_fds).fds_bits[2] = 0;
  (piVar9->read_fds).fds_bits[3] = 0;
  (piVar9->read_fds).fds_bits[4] = 0;
  (piVar9->read_fds).fds_bits[5] = 0;
  (piVar9->read_fds).fds_bits[6] = 0;
  (piVar9->read_fds).fds_bits[7] = 0;
  (piVar9->read_fds).fds_bits[8] = 0;
  (piVar9->read_fds).fds_bits[9] = 0;
  (piVar9->read_fds).fds_bits[10] = 0;
  (piVar9->read_fds).fds_bits[0xb] = 0;
  (piVar9->read_fds).fds_bits[0xc] = 0;
  (piVar9->read_fds).fds_bits[0xd] = 0;
  (piVar9->read_fds).fds_bits[0xe] = 0;
  (piVar9->read_fds).fds_bits[0xf] = 0;
  piVar9 = this->impl;
  (piVar9->write_fds).fds_bits[2] = 0;
  (piVar9->write_fds).fds_bits[3] = 0;
  (piVar9->write_fds).fds_bits[4] = 0;
  (piVar9->write_fds).fds_bits[5] = 0;
  (piVar9->write_fds).fds_bits[6] = 0;
  (piVar9->write_fds).fds_bits[7] = 0;
  (piVar9->write_fds).fds_bits[8] = 0;
  (piVar9->write_fds).fds_bits[9] = 0;
  (piVar9->write_fds).fds_bits[10] = 0;
  (piVar9->write_fds).fds_bits[0xb] = 0;
  (piVar9->write_fds).fds_bits[0xc] = 0;
  (piVar9->write_fds).fds_bits[0xd] = 0;
  (piVar9->write_fds).fds_bits[0xe] = 0;
  (piVar9->write_fds).fds_bits[0xf] = 0;
  (piVar9->write_fds).fds_bits[0] = 0;
  (piVar9->write_fds).fds_bits[1] = 0;
  piVar9 = this->impl;
  (piVar9->except_fds).fds_bits[0xe] = 0;
  (piVar9->except_fds).fds_bits[0xf] = 0;
  (piVar9->except_fds).fds_bits[0xc] = 0;
  (piVar9->except_fds).fds_bits[0xd] = 0;
  (piVar9->except_fds).fds_bits[10] = 0;
  (piVar9->except_fds).fds_bits[0xb] = 0;
  (piVar9->except_fds).fds_bits[8] = 0;
  (piVar9->except_fds).fds_bits[9] = 0;
  (piVar9->except_fds).fds_bits[6] = 0;
  (piVar9->except_fds).fds_bits[7] = 0;
  (piVar9->except_fds).fds_bits[4] = 0;
  (piVar9->except_fds).fds_bits[5] = 0;
  (piVar9->except_fds).fds_bits[2] = 0;
  (piVar9->except_fds).fds_bits[3] = 0;
  (piVar9->except_fds).fds_bits[0] = 0;
  (piVar9->except_fds).fds_bits[1] = 0;
  plVar1 = &this->clients;
  for (p_Var8 = (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar1;
      p_Var8 = p_Var8->_M_next) {
    p_Var5 = p_Var8[1]._M_next;
    if (p_Var5[6]._M_next != p_Var5[3]._M_prev) {
      iVar3 = *(int *)&p_Var5->_M_prev->_M_next;
      iVar13 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar13 = iVar3;
      }
      p_Var2 = (this->impl->read_fds).fds_bits + (iVar13 >> 6);
      *p_Var2 = *p_Var2 | 1L << ((byte)iVar3 & 0x3f);
    }
    if (p_Var5[9]._M_prev != (_List_node_base *)0x0) {
      iVar3 = *(int *)&p_Var5->_M_prev->_M_next;
      iVar13 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar13 = iVar3;
      }
      p_Var2 = (this->impl->write_fds).fds_bits + (iVar13 >> 6);
      *p_Var2 = *p_Var2 | 1L << ((byte)iVar3 & 0x3f);
    }
    iVar3 = *(int *)&p_Var5->_M_prev->_M_next;
    iVar13 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar13 = iVar3;
    }
    p_Var2 = (this->impl->except_fds).fds_bits + (iVar13 >> 6);
    *p_Var2 = *p_Var2 | 1L << ((byte)iVar3 & 0x3f);
    iVar3 = *(int *)&p_Var5->_M_prev->_M_next;
    if (iVar7 < iVar3) {
      iVar7 = iVar3;
    }
  }
  iVar3 = this->impl->sock;
  iVar13 = iVar3 + 0x3f;
  if (-1 < iVar3) {
    iVar13 = iVar3;
  }
  p_Var2 = (this->impl->except_fds).fds_bits + (iVar13 >> 6);
  *p_Var2 = *p_Var2 | 1L << ((byte)iVar3 & 0x3f);
  piVar9 = this->impl;
  iVar7 = select(iVar7 + 1,(fd_set *)piVar9,(fd_set *)&piVar9->write_fds,
                 (fd_set *)&piVar9->except_fds,&local_30);
  if (iVar7 == -1) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
    OSErrorString();
    puVar10[1] = ErrorBuf;
    *puVar10 = &PTR__exception_00201388;
    __cxa_throw(puVar10,&Socket_SelectFailed::typeinfo,std::exception::~exception);
  }
  if (0 < iVar7) {
    uVar4 = this->impl->sock;
    uVar11 = uVar4 + 0x3f;
    if (-1 < (int)uVar4) {
      uVar11 = uVar4;
    }
    if (((ulong)(this->impl->except_fds).fds_bits[(int)uVar11 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) !=
        0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = &PTR__exception_00201360;
      puVar10[1] = "There was an exception on the listening socket.";
      __cxa_throw(puVar10,&Socket_Exception::typeinfo,std::exception::~exception);
    }
    for (p_Var8 = (plVar1->super__List_base<Client_*,_std::allocator<Client_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar1;
        p_Var8 = p_Var8->_M_next) {
      this_00 = (Client *)p_Var8[1]._M_next;
      piVar9 = this->impl;
      uVar4 = ((this_00->impl)._M_t.
               super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
               super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
               super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock;
      uVar11 = uVar4 + 0x3f;
      if (-1 < (int)uVar4) {
        uVar11 = uVar4;
      }
      lVar12 = (long)((int)uVar11 >> 6);
      uVar14 = 1L << ((byte)uVar4 & 0x3f);
      if (((ulong)(piVar9->except_fds).fds_bits[lVar12] >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if (((piVar9->read_fds).fds_bits[lVar12] & uVar14) != 0) {
          bVar6 = Client::DoRecv(this_00);
          if (!bVar6) goto LAB_0014a729;
          piVar9 = this->impl;
          iVar7 = ((this_00->impl)._M_t.
                   super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
                   super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
                   super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock;
          iVar3 = iVar7 + 0x3f;
          if (-1 < iVar7) {
            iVar3 = iVar7;
          }
          lVar12 = (long)(iVar3 >> 6);
          uVar14 = 1L << ((byte)iVar7 & 0x3f);
        }
        if ((((piVar9->write_fds).fds_bits[lVar12] & uVar14) != 0) &&
           (bVar6 = Client::DoSend(this_00), !bVar6)) goto LAB_0014a729;
      }
      else {
LAB_0014a729:
        Client::Close(this_00,true);
      }
    }
  }
  for (p_Var8 = (plVar1->super__List_base<Client_*,_std::allocator<Client_*>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar1;
      p_Var8 = p_Var8->_M_next) {
    local_38 = (Client *)p_Var8[1]._M_next;
    if ((local_38->recv_buffer_used != 0) ||
       (iVar7 = (**local_38->_vptr_Client)(), (char)iVar7 != '\0')) {
      if (Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Client*,std::allocator<Client*>>::_M_realloc_insert<Client*const&>
                  ((vector<Client*,std::allocator<Client*>> *)&Select::selected,
                   (iterator)
                   Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  return &Select::selected;
}

Assistant:

std::vector<Client *> *Server::Select(double timeout)
{
	long tsecs = long(timeout);
	timeval timeout_val = {tsecs, long((timeout - double(tsecs))*1000000)};
	static std::vector<Client *> selected;
	SOCKET nfds = this->impl->sock;
	int result;

	FD_ZERO(&this->impl->read_fds);
	FD_ZERO(&this->impl->write_fds);
	FD_ZERO(&this->impl->except_fds);

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used != client->recv_buffer.length())
		{
			FD_SET(client->impl->sock, &this->impl->read_fds);
		}

		if (client->send_buffer_used > 0)
		{
			FD_SET(client->impl->sock, &this->impl->write_fds);
		}

		FD_SET(client->impl->sock, &this->impl->except_fds);

		if (client->impl->sock > nfds)
		{
			nfds = client->impl->sock;
		}
	}

	FD_SET(this->impl->sock, &this->impl->except_fds);

	result = select(nfds+1, &this->impl->read_fds, &this->impl->write_fds, &this->impl->except_fds, &timeout_val);

	if (result == -1)
	{
		throw Socket_SelectFailed(OSErrorString());
	}

	if (result > 0)
	{
		if (FD_ISSET(this->impl->sock, &this->impl->except_fds))
		{
			throw Socket_Exception("There was an exception on the listening socket.");
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (FD_ISSET(client->impl->sock, &this->impl->except_fds))
			{
				client->Close(true);
				continue;
			}

			if (FD_ISSET(client->impl->sock, &this->impl->read_fds))
			{
				if (!client->DoRecv())
				{
					client->Close(true);
					continue;
				}
			}

			if (FD_ISSET(client->impl->sock, &this->impl->write_fds))
			{
				if (!client->DoSend())
				{
					client->Close(true);
					continue;
				}
			}
		}
	}

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used > 0 || client->NeedTick())
		{
			selected.push_back(client);
		}
	}

	return &selected;
}